

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O2

uint32_t __thiscall
ixy::IxgbeDevice::tx_batch
          (IxgbeDevice *this,uint16_t queue_id,
          deque<ixy::Packet,_std::allocator<ixy::Packet>_> *buffer)

{
  uint16_t uVar1;
  undefined2 uVar2;
  _Elt_pointer pPVar3;
  ixgbe_adv_tx_desc *piVar4;
  ushort uVar5;
  uint uVar6;
  reference queue;
  long lVar7;
  uint32_t uVar8;
  undefined6 in_register_00000032;
  
  queue = std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::at
                    (&this->tx_queues,CONCAT62(in_register_00000032,queue_id) & 0xffffffff);
  clean_tx_queue(queue);
  uVar1 = queue->clean_index;
  uVar6 = (uint)queue->tx_index;
  if (((queue->mempool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) &&
     (pPVar3 = (buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
               super__Deque_impl_data._M_start._M_cur,
     (buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
     super__Deque_impl_data._M_finish._M_cur != pPVar3)) {
    std::__shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(queue->mempool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>,
               &(pPVar3->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>);
  }
  uVar8 = 0;
  while (pPVar3 = (buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_cur,
        (buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_cur != pPVar3) {
    uVar6 = *(int *)&queue->num_entries - 1U & uVar6 + 1;
    uVar5 = queue->tx_index;
    if (uVar1 == (uint16_t)uVar6) goto LAB_00106eea;
    piVar4 = queue->descriptors;
    lVar7 = (ulong)uVar5 * 0x10;
    piVar4[uVar5].read.buffer_addr = pPVar3->addr_phys;
    *(uint *)((long)piVar4 + lVar7 + 8) = (uint)pPVar3->len | 0x2b300000;
    *(int *)((long)piVar4 + lVar7 + 0xc) = (int)pPVar3->len << 0xe;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&queue->bufs_in_use,&pPVar3->pool_entry);
    std::__shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(pPVar3->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>);
    uVar2 = queue->num_entries;
    queue->tx_index = uVar2 - 1 & (short)*(undefined4 *)&queue->tx_index + 1U;
    std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::pop_front(buffer);
    uVar8 = uVar8 + 1;
  }
  uVar5 = queue->tx_index;
LAB_00106eea:
  set_reg32(this,(ulong)(uint)((int)CONCAT62(in_register_00000032,queue_id) << 6) + 0x6018,
            (uint)uVar5);
  return uVar8;
}

Assistant:

auto IxgbeDevice::tx_batch(uint16_t queue_id, std::deque<Packet> &buffer) -> uint32_t {
    auto sent_packets = 0;

    struct ixgbe_tx_queue *queue = &tx_queues.at(queue_id);

    clean_tx_queue(queue);

    auto cur_index = queue->tx_index;
    auto clean_index = queue->clean_index;

    if (!queue->mempool && !buffer.empty()) {
        queue->mempool = buffer.front().pool;
    }

    while (!buffer.empty()) {
        auto &p = buffer.front();

        auto next_index = wrap_ring(cur_index, queue->num_entries);

        if (clean_index == next_index) {
            // tx queue of device is full
            break;
        }

        volatile union ixgbe_adv_tx_desc *txd = queue->descriptors + queue->tx_index;
        // NIC reads from here
        txd->read.buffer_addr = p.get_phys_addr();
        // always the same flags: one buffer (EOP), advanced data descriptor, CRC offload, data length
        txd->read.cmd_type_len =
                static_cast<u32>(IXGBE_ADVTXD_DCMD_EOP | IXGBE_ADVTXD_DCMD_RS | IXGBE_ADVTXD_DCMD_IFCS |
                                 IXGBE_ADVTXD_DCMD_DEXT |
                                 IXGBE_ADVTXD_DTYP_DATA | p.size());
        // no fancy offloading stuff - only the total payload length
        // implement offloading flags here:
        // 	* ip checksum offloading is trivial: just set the offset
        // 	* tcp/udp checksum offloading is more annoying, you have to precalculate the pseudo-header checksum
        txd->read.olinfo_status = static_cast<u32>(p.size() << IXGBE_ADVTXD_PAYLEN_SHIFT);

        queue->bufs_in_use.push_back(p.pool_entry);

        p.pool.reset();

        queue->tx_index = wrap_ring(queue->tx_index, queue->num_entries);

        buffer.pop_front();

        cur_index = next_index;
        sent_packets += 1;
    }

    set_reg32(IXGBE_TDT(queue_id), queue->tx_index);

    return sent_packets;
}